

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_valddi.cpp
# Opt level: O2

ze_result_t
zesGetDiagnosticsProcAddrTable(ze_api_version_t version,zes_diagnostics_dditable_t *pDdiTable)

{
  zes_pfnDiagnosticsGetTests_t p_Var1;
  ze_api_version_t *pzVar2;
  ze_result_t zVar3;
  
  pzVar2 = validation_layer::context;
  if (pDdiTable == (zes_diagnostics_dditable_t *)0x0) {
    zVar3 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else {
    zVar3 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if (((*validation_layer::context ^ version) < ZE_API_VERSION_1_0) &&
       ((*validation_layer::context & 0xffff) <= (version & 0xffff))) {
      p_Var1 = pDdiTable->pfnGetTests;
      *(zes_pfnDiagnosticsGetProperties_t *)(validation_layer::context + 0x334) =
           pDdiTable->pfnGetProperties;
      *(zes_pfnDiagnosticsGetTests_t *)(pzVar2 + 0x336) = p_Var1;
      pDdiTable->pfnGetProperties = validation_layer::zesDiagnosticsGetProperties;
      pDdiTable->pfnGetTests = validation_layer::zesDiagnosticsGetTests;
      *(zes_pfnDiagnosticsRunTests_t *)(pzVar2 + 0x338) = pDdiTable->pfnRunTests;
      pDdiTable->pfnRunTests = validation_layer::zesDiagnosticsRunTests;
      return ZE_RESULT_SUCCESS;
    }
  }
  return zVar3;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zesGetDiagnosticsProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    zes_diagnostics_dditable_t* pDdiTable           ///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = validation_layer::context.zesDdiTable.Diagnostics;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(validation_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(validation_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnGetProperties                            = pDdiTable->pfnGetProperties;
    pDdiTable->pfnGetProperties                          = validation_layer::zesDiagnosticsGetProperties;

    dditable.pfnGetTests                                 = pDdiTable->pfnGetTests;
    pDdiTable->pfnGetTests                               = validation_layer::zesDiagnosticsGetTests;

    dditable.pfnRunTests                                 = pDdiTable->pfnRunTests;
    pDdiTable->pfnRunTests                               = validation_layer::zesDiagnosticsRunTests;

    return result;
}